

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::predict_or_learn_greedy<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  float fVar1;
  reference ppeVar2;
  polyprediction *this;
  size_t sVar3;
  size_t sVar4;
  action_score *paVar5;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  uint64_t in_RSI;
  multi_ex *in_RDI;
  multi_learner *unaff_retaddr;
  size_t i_1;
  size_t i;
  float prob;
  size_t tied_actions;
  uint32_t num_actions;
  action_scores *preds;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  float fVar6;
  undefined4 uVar7;
  ulong local_48;
  ulong local_40;
  
  uVar7 = 0;
  ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
  in_RDI[5].super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)((*ppeVar2)->super_example_predict).ft_offset
  ;
  LEARNER::multiline_learn_or_predict<false>
            (unaff_retaddr,in_RDI,in_RSI,(uint32_t)((ulong)in_RDX >> 0x20));
  ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
  this = &(*ppeVar2)->pred;
  sVar3 = v_array<ACTION_SCORE::action_score>::size
                    ((v_array<ACTION_SCORE::action_score> *)&this->scalars);
  sVar4 = fill_tied((cb_explore_adf *)CONCAT44(uVar7,in_stack_ffffffffffffffa8),
                    (v_array<ACTION_SCORE::action_score> *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  fVar1 = *(float *)&in_RDI[4].super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
  for (local_40 = 0; local_40 < (sVar3 & 0xffffffff); local_40 = local_40 + 1) {
    fVar6 = fVar1 / (float)(sVar3 & 0xffffffff);
    paVar5 = v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)&this->scalars,local_40);
    paVar5->score = fVar6;
  }
  if (((ulong)in_RDI[6].super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
              super__Vector_impl_data._M_start & 0x100) == 0) {
    for (local_48 = 0; local_48 < sVar4; local_48 = local_48 + 1) {
      fVar1 = *(float *)&in_RDI[4].super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
      paVar5 = v_array<ACTION_SCORE::action_score>::operator[]
                         ((v_array<ACTION_SCORE::action_score> *)&this->scalars,local_48);
      paVar5->score = (1.0 - fVar1) / (float)sVar4 + paVar5->score;
    }
  }
  else {
    fVar1 = *(float *)&in_RDI[4].super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
    paVar5 = v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)&this->scalars,0);
    paVar5->score = (1.0 - fVar1) + paVar5->score;
  }
  return;
}

Assistant:

void predict_or_learn_greedy(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  data.offset = examples[0]->ft_offset;
  // Explore uniform random an epsilon fraction of the time.

  if (is_learn && test_adf_sequence(examples) != nullptr)
    multiline_learn_or_predict<true>(base, examples, data.offset);
  else
    multiline_learn_or_predict<false>(base, examples, data.offset);
  action_scores& preds = examples[0]->pred.a_s;

  uint32_t num_actions = (uint32_t)preds.size();

  size_t tied_actions = fill_tied(data, preds);

  const float prob = data.epsilon / num_actions;
  for (size_t i = 0; i < num_actions; i++) preds[i].score = prob;
  if (!data.first_only)
  {
    for (size_t i = 0; i < tied_actions; ++i) preds[i].score += (1.f - data.epsilon) / tied_actions;
  }
  else
    preds[0].score += 1.f - data.epsilon;
}